

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# as-02-unwrap.cpp
# Opt level: O0

CommandOptions * read_iab_file(CommandOptions *Options,IFileReaderFactory *fileReaderFactory)

{
  _func_int **__s;
  bool bVar1;
  int iVar2;
  ui32_t lhs;
  uint uVar3;
  long *plVar4;
  Dictionary *pDVar5;
  byte_t *pbVar6;
  unsigned_long_long *puVar7;
  IFileReaderFactory *in_RDX;
  long local_400;
  long *local_3c0;
  Result_t local_368 [108];
  uint local_2fc;
  Result_t local_2f8 [4];
  ui32_t i;
  long local_290;
  SourceClip *sourceClip;
  Result_t local_220 [108];
  undefined4 local_1b4;
  Result_t local_1b0 [104];
  long local_148;
  InterchangeObject *tmp_obj;
  string local_138 [32];
  string local_118 [8];
  Result_t result;
  IABEssenceDescriptor *iab_descriptor;
  ui32_t last_frame;
  FrameBuffer local_98 [8];
  FrameBuffer FrameBuffer;
  MXFReader local_70 [8];
  MXFReader Reader;
  HMACContext *HMAC;
  AESDecContext *Context;
  IFileReaderFactory *fileReaderFactory_local;
  CommandOptions *Options_local;
  
  AS_02::IAB::MXFReader::MXFReader(local_70,in_RDX);
  ASDCP::FrameBuffer::FrameBuffer(local_98);
  iab_descriptor._0_4_ = 0;
  __s = fileReaderFactory[0xb]._vptr_IFileReaderFactory;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_138,(char *)__s,(allocator<char> *)((long)&tmp_obj + 7));
  AS_02::IAB::MXFReader::OpenRead(local_118);
  std::__cxx11::string::~string(local_138);
  std::allocator<char>::~allocator((allocator<char> *)((long)&tmp_obj + 7));
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)local_118);
  if (-1 < iVar2) {
    if (((ulong)fileReaderFactory->_vptr_IFileReaderFactory & 0x10000000000) != 0) {
      fprintf(_stderr,"Frame Buffer size: %u\n",
              (ulong)*(uint *)((long)&fileReaderFactory[4]._vptr_IFileReaderFactory + 4));
    }
    local_148 = 0;
    plVar4 = (long *)AS_02::IAB::MXFReader::OP1aHeader();
    pDVar5 = (Dictionary *)ASDCP::DefaultCompositeDict();
    pbVar6 = ASDCP::Dictionary::ul(pDVar5,MDD_IABEssenceDescriptor);
    (**(code **)(*plVar4 + 0xa8))(local_1b0,plVar4,pbVar6);
    Kumu::Result_t::operator=((Result_t *)local_118,local_1b0);
    Kumu::Result_t::~Result_t(local_1b0);
    iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)local_118);
    if (-1 < iVar2) {
      if (local_148 == 0) {
        local_3c0 = (long *)0x0;
      }
      else {
        local_3c0 = (long *)__dynamic_cast(local_148,&ASDCP::MXF::InterchangeObject::typeinfo,
                                           &ASDCP::MXF::IABEssenceDescriptor::typeinfo);
      }
      if (local_3c0 == (long *)0x0) {
        fprintf(_stderr,"File does not contain an essence descriptor.\n");
        Kumu::Result_t::Result_t((Result_t *)Options,(Result_t *)Kumu::RESULT_FAIL);
        goto LAB_00114a2e;
      }
      if (((ulong)fileReaderFactory->_vptr_IFileReaderFactory & 0x10000000000) != 0) {
        (**(code **)(*local_3c0 + 0x88))(local_3c0,0);
      }
      puVar7 = ASDCP::MXF::optional_property<unsigned_long_long>::get
                         ((optional_property<unsigned_long_long> *)(local_3c0 + 0x1f));
      if (*puVar7 == 0) {
        fprintf(_stderr,
                "ContainerDuration not set in file descriptor, attempting to use index duration.\n")
        ;
        AS_02::IAB::MXFReader::GetFrameCount((uint *)local_220);
        Kumu::Result_t::~Result_t(local_220);
      }
      else {
        puVar7 = ASDCP::MXF::optional_property::operator_cast_to_unsigned_long_long_
                           ((optional_property *)(local_3c0 + 0x1f));
        iab_descriptor._0_4_ = (uint)*puVar7;
      }
      if ((uint)iab_descriptor == 0) {
        fprintf(_stderr,
                "ContainerDuration not set in index, attempting to use Duration from SourceClip.\n")
        ;
        plVar4 = (long *)AS_02::IAB::MXFReader::OP1aHeader();
        pDVar5 = (Dictionary *)ASDCP::DefaultCompositeDict();
        pbVar6 = ASDCP::Dictionary::ul(pDVar5,MDD_SourceClip);
        (**(code **)(*plVar4 + 0xa8))(&sourceClip,plVar4,pbVar6);
        Kumu::Result_t::operator=((Result_t *)local_118,(Result_t *)&sourceClip);
        Kumu::Result_t::~Result_t((Result_t *)&sourceClip);
        iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)local_118);
        if (-1 < iVar2) {
          if (local_148 == 0) {
            local_400 = 0;
          }
          else {
            local_400 = __dynamic_cast(local_148,&ASDCP::MXF::InterchangeObject::typeinfo,
                                       &ASDCP::MXF::SourceClip::typeinfo);
          }
          local_290 = local_400;
          bVar1 = ASDCP::MXF::optional_property<unsigned_long_long>::empty
                            ((optional_property<unsigned_long_long> *)(local_400 + 0xc0));
          if (!bVar1) {
            puVar7 = ASDCP::MXF::optional_property::operator_cast_to_unsigned_long_long_
                               ((optional_property *)(local_290 + 0xc0));
            iab_descriptor._0_4_ = (uint)*puVar7;
          }
        }
      }
      if ((uint)iab_descriptor == 0) {
        fprintf(_stderr,"Unable to determine file duration.\n");
        Kumu::Result_t::Result_t((Result_t *)Options,(Result_t *)Kumu::RESULT_FAIL);
        goto LAB_00114a2e;
      }
      if (local_3c0 == (long *)0x0) {
        __assert_fail("iab_descriptor",
                      "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/as-02-unwrap.cpp"
                      ,0x422,
                      "Result_t read_iab_file(CommandOptions &, const Kumu::IFileReaderFactory &)");
      }
      ASDCP::FrameBuffer::Capacity((uint)local_2f8);
      Kumu::Result_t::~Result_t(local_2f8);
      puVar7 = ASDCP::MXF::optional_property::operator_cast_to_unsigned_long_long_
                         ((optional_property *)(local_3c0 + 0x1f));
      iab_descriptor._0_4_ = (uint)*puVar7;
    }
  }
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)local_118);
  if (-1 < iVar2) {
    if ((*(int *)&fileReaderFactory[3]._vptr_IFileReaderFactory != 0) &&
       (*(uint *)&fileReaderFactory[3]._vptr_IFileReaderFactory < (uint)iab_descriptor)) {
      iab_descriptor._0_4_ = *(uint *)&fileReaderFactory[3]._vptr_IFileReaderFactory;
    }
    if (*(int *)((long)&fileReaderFactory[2]._vptr_IFileReaderFactory + 4) != 0) {
      if ((uint)iab_descriptor < *(uint *)((long)&fileReaderFactory[2]._vptr_IFileReaderFactory + 4)
         ) {
        fprintf(_stderr,"Start value greater than file duration.\n");
        Kumu::Result_t::Result_t((Result_t *)Options,(Result_t *)Kumu::RESULT_FAIL);
        goto LAB_00114a2e;
      }
      iab_descriptor._0_4_ =
           Kumu::xmin<unsigned_int>
                     (*(int *)((long)&fileReaderFactory[2]._vptr_IFileReaderFactory + 4) +
                      (uint)iab_descriptor,(uint)iab_descriptor);
    }
    iab_descriptor._0_4_ =
         (uint)iab_descriptor - *(int *)((long)&fileReaderFactory[2]._vptr_IFileReaderFactory + 4);
  }
  local_2fc = *(uint *)((long)&fileReaderFactory[2]._vptr_IFileReaderFactory + 4);
  while (iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)local_118),
        -1 < iVar2 && local_2fc < (uint)iab_descriptor) {
    AS_02::IAB::MXFReader::ReadFrame((uint)local_368,(FrameBuffer *)local_70);
    Kumu::Result_t::operator=((Result_t *)local_118,local_368);
    Kumu::Result_t::~Result_t(local_368);
    iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)local_118);
    if ((-1 < iVar2) && (((ulong)fileReaderFactory->_vptr_IFileReaderFactory & 0x10000000000) != 0))
    {
      ASDCP::FrameBuffer::FrameNumber(local_98,local_2fc);
      fprintf(_stdout,"Frame(%d):\n",(ulong)local_2fc);
      pbVar6 = ASDCP::FrameBuffer::RoData(local_98);
      lhs = ASDCP::FrameBuffer::Size(local_98);
      uVar3 = Kumu::xmin<unsigned_int>(lhs,*(uint *)&fileReaderFactory[1]._vptr_IFileReaderFactory);
      Kumu::hexdump(pbVar6,uVar3,_stdout);
    }
    local_2fc = local_2fc + 1;
  }
  Kumu::Result_t::Result_t((Result_t *)Options,(Result_t *)local_118);
LAB_00114a2e:
  local_1b4 = 1;
  Kumu::Result_t::~Result_t((Result_t *)local_118);
  ASDCP::FrameBuffer::~FrameBuffer(local_98);
  AS_02::IAB::MXFReader::~MXFReader(local_70);
  return Options;
}

Assistant:

Result_t read_iab_file(CommandOptions& Options, const Kumu::IFileReaderFactory& fileReaderFactory)
{
    AESDecContext*     Context = 0;
    HMACContext*       HMAC = 0;
    AS_02::IAB::MXFReader Reader(fileReaderFactory);
    ASDCP::FrameBuffer   FrameBuffer;

    ui32_t last_frame = 0;
    ASDCP::MXF::IABEssenceDescriptor *iab_descriptor = 0;

    Result_t result = Reader.OpenRead(Options.input_filename);

    if ( KM_SUCCESS(result) )
    {
        if ( Options.verbose_flag )
        {
            fprintf(stderr, "Frame Buffer size: %u\n", Options.fb_size);
        }

        ASDCP::MXF::InterchangeObject* tmp_obj = 0;

        result = Reader.OP1aHeader().GetMDObjectByType(DefaultCompositeDict().ul(MDD_IABEssenceDescriptor), &tmp_obj);

        if ( KM_SUCCESS(result) )
        {
            iab_descriptor = dynamic_cast<ASDCP::MXF::IABEssenceDescriptor*>(tmp_obj);

            if ( iab_descriptor == 0 )
            {
                fprintf(stderr, "File does not contain an essence descriptor.\n");
                return RESULT_FAIL;
            }

            if ( Options.verbose_flag )
            {
                iab_descriptor->Dump();
            }

            if ( iab_descriptor->ContainerDuration.get() == 0 )
            {
                fprintf(stderr, "ContainerDuration not set in file descriptor, attempting to use index duration.\n");
                Reader.GetFrameCount(last_frame);
            }
            else
            {
                last_frame = (ui32_t)iab_descriptor->ContainerDuration;
            }

            if ( last_frame == 0 )
            {
                fprintf(stderr, "ContainerDuration not set in index, attempting to use Duration from SourceClip.\n");
                result = Reader.OP1aHeader().GetMDObjectByType(DefaultCompositeDict().ul(MDD_SourceClip), &tmp_obj);
                if ( KM_SUCCESS(result))
                {
                    ASDCP::MXF::SourceClip *sourceClip = dynamic_cast<ASDCP::MXF::SourceClip*>(tmp_obj);
                    if ( ! sourceClip->Duration.empty() )
                    {
                        last_frame = (ui32_t)sourceClip->Duration;
                    }
                }
            }

            if ( last_frame == 0 )
            {
                fprintf(stderr, "Unable to determine file duration.\n");
                return RESULT_FAIL;
            }

            assert(iab_descriptor);
            FrameBuffer.Capacity(24000); // TODO what size?
            last_frame = (ui32_t)iab_descriptor->ContainerDuration;
        }
    }

    if ( ASDCP_SUCCESS(result) )
    {
        if ( Options.duration > 0 && Options.duration < last_frame )
            last_frame = Options.duration;

        if ( Options.start_frame > 0 )
        {
            if ( Options.start_frame > last_frame )
            {
                fprintf(stderr, "Start value greater than file duration.\n");
                return RESULT_FAIL;
            }

            last_frame = Kumu::xmin(Options.start_frame + last_frame, last_frame);
        }

        last_frame = last_frame - Options.start_frame;


    }

    for ( ui32_t i = Options.start_frame; ASDCP_SUCCESS(result) && i < last_frame; i++ )
    {
        result = Reader.ReadFrame(i, FrameBuffer);

        if ( ASDCP_SUCCESS(result) )
        {
            if ( Options.verbose_flag )
            {
                FrameBuffer.FrameNumber(i);
                fprintf(stdout, "Frame(%d):\n", i);
                Kumu::hexdump(FrameBuffer.RoData(), Kumu::xmin(FrameBuffer.Size(), (ui32_t)Options.fb_dump_size), stdout);
            }
        }
    }

    return result;
}